

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  cmake *pcVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  pointer pcVar6;
  pointer filename;
  pointer pcVar7;
  bool bVar8;
  string local_248;
  string temp;
  string local_208;
  long *local_1e8;
  long local_1d8 [2];
  string local_1c8;
  ostringstream msg;
  ios_base local_138 [264];
  
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  GetExecutionFilePath_abi_cxx11_(&local_248,this);
  cmsys::SystemTools::GetFilenameName(&local_208,&local_248);
  filename = (pcVar2->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (filename ==
      (pcVar2->TraceOnlyThisSources).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002b7d74:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&msg,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):  ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&msg,(lff->super_cmCommandContext).Name._M_dataplus._M_p,
                        (lff->super_cmCommandContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
    bVar1 = this->GlobalGenerator->CMakeInstance->TraceExpand;
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    pcVar7 = (lff->Arguments).
             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar7 != (lff->Arguments).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar6 = pcVar7;
        if (bVar1 != false) {
          std::__cxx11::string::_M_assign((string *)&temp);
          ExpandVariablesInString(this,&temp,false,false,false,(char *)0x0,-1,false,false);
          pcVar6 = (pointer)&temp;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&msg,(pcVar6->Value)._M_dataplus._M_p,(pcVar6->Value)._M_string_length
                  );
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg," ",1);
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != (lff->Arguments).
                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&msg,")",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((char *)local_1e8,(char *)0x0);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)temp._M_dataplus._M_p != &temp.field_2) {
      operator_delete(temp._M_dataplus._M_p,
                      CONCAT71(temp.field_2._M_allocated_capacity._1_7_,temp.field_2._M_local_buf[0]
                              ) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    std::ios_base::~ios_base(local_138);
  }
  else if (filename !=
           (pcVar2->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      lVar4 = std::__cxx11::string::rfind
                        ((char *)&local_248,(ulong)(filename->_M_dataplus)._M_p,0xffffffffffffffff);
      if ((lVar4 == -1) || (lVar4 + filename->_M_string_length != local_248._M_string_length)) {
        bVar1 = false;
LAB_002b7d28:
        bVar8 = false;
      }
      else {
        cmsys::SystemTools::GetFilenameName(&local_1c8,filename);
        if (local_208._M_string_length != local_1c8._M_string_length) {
          bVar1 = true;
          goto LAB_002b7d28;
        }
        bVar1 = true;
        if (local_208._M_string_length == 0) {
          bVar8 = true;
        }
        else {
          iVar3 = bcmp(local_208._M_dataplus._M_p,local_1c8._M_dataplus._M_p,
                       local_208._M_string_length);
          bVar8 = iVar3 == 0;
        }
      }
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (bVar8) goto LAB_002b7d74;
      filename = filename + 1;
    } while (filename !=
             (pcVar2->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::vector<std::string>::const_iterator i =
           trace_only_this_files.begin();
         !trace && i != trace_only_this_files.end(); ++i) {
      std::string::size_type const pos = full_path.rfind(*i);
      trace = (pos != std::string::npos) &&
        ((pos + i->size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(*i));
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (std::vector<cmListFileArgument>::const_iterator i =
         lff.Arguments.begin();
       i != lff.Arguments.end(); ++i) {
    if (expand) {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << i->Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}